

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_EnumOptionValueIsSiblingEnumValueName_Test::TestBody
          (ValidationErrorTest_EnumOptionValueIsSiblingEnumValueName_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60
  ;
  allocator<char> local_31;
  string local_30;
  ValidationErrorTest_EnumOptionValueIsSiblingEnumValueName_Test *local_10;
  ValidationErrorTest_EnumOptionValueIsSiblingEnumValueName_Test *this_local;
  
  local_10 = this;
  ValidationErrorTest::BuildDescriptorMessagesInTestPool(&this->super_ValidationErrorTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "name: \"foo.proto\" dependency: \"google/protobuf/descriptor.proto\" enum_type { name: \"FooEnum1\" value { name: \"BAR\" number: 1 }                                value { name: \"BAZ\" number: 2 } }enum_type { name: \"FooEnum2\" value { name: \"MOO\" number: 1 }                                value { name: \"MOOO\" number: 2 } }extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL             type: TYPE_ENUM type_name: \"FooEnum1\"             extendee: \"google.protobuf.FileOptions\" }options { uninterpreted_option { name { name_part: \"foo\"                                         is_extension: true }                                  identifier_value: \"MOOO\" } }"
             ,&local_31);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_60,
            "foo.proto: foo.proto: OPTION_VALUE: Enum type \"FooEnum1\" has no value named \"MOOO\" for option \"foo\". This appears to be a value from a sibling type.\n"
           );
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_30,&local_60);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_60);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, EnumOptionValueIsSiblingEnumValueName) {
  BuildDescriptorMessagesInTestPool();

  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "enum_type { name: \"FooEnum1\" value { name: \"BAR\" number: 1 } "
      "                               value { name: \"BAZ\" number: 2 } }"
      "enum_type { name: \"FooEnum2\" value { name: \"MOO\" number: 1 } "
      "                               value { name: \"MOOO\" number: 2 } }"
      "extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_ENUM type_name: \"FooEnum1\" "
      "            extendee: \"google.protobuf.FileOptions\" }"
      "options { uninterpreted_option { name { name_part: \"foo\" "
      "                                        is_extension: true } "
      "                                 identifier_value: \"MOOO\" } }",

      "foo.proto: foo.proto: OPTION_VALUE: Enum type \"FooEnum1\" has no value "
      "named \"MOOO\" for option \"foo\". This appears to be a value from a "
      "sibling type.\n");
}